

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void recalculate_stats(int *stats_local_local,wchar_t points_left_local)

{
  int16_t iVar1;
  int local_18;
  wchar_t i;
  wchar_t points_left_local_local;
  int *stats_local_local_local;
  
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    iVar1 = (int16_t)stats_local_local[local_18];
    player->stat_birth[local_18] = iVar1;
    player->stat_max[local_18] = iVar1;
    player->stat_cur[local_18] = iVar1;
    player->stat_map[local_18] = (int16_t)local_18;
  }
  player->au_birth = (uint)z_info->start_gold + points_left_local * 0x32;
  get_bonuses();
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  return;
}

Assistant:

static void recalculate_stats(int *stats_local_local, int points_left_local)
{
	int i;

	/* Variable stat maxes */
	for (i = 0; i < STAT_MAX; i++) {
		player->stat_cur[i] = player->stat_max[i] =
				player->stat_birth[i] = stats_local_local[i];
		player->stat_map[i] = i;
	}

	/* Gold is inversely proportional to cost */
	player->au_birth = z_info->start_gold + (50 * points_left_local);

	/* Update bonuses, hp, etc. */
	get_bonuses();

	/* Tell the UI about all this stuff that's changed. */
	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);
}